

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O2

void __thiscall OpenMD::CubicSpline::generate(CubicSpline *this)

{
  uint uVar1;
  vector<double,_std::allocator<double>_> *v;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  int iVar7;
  double *pdVar8;
  bool bVar9;
  int k_1;
  uint uVar10;
  CubicSpline *pCVar11;
  long lVar12;
  long lVar13;
  int k;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 local_50 [24];
  vector<int,_std::allocator<int>_> p;
  
  v = &this->x_;
  iVar7 = (int)((ulong)((long)(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  this->n = iVar7;
  std::vector<double,_std::allocator<double>_>::resize(&this->b,(long)iVar7);
  std::vector<double,_std::allocator<double>_>::resize(&this->c,(long)this->n);
  std::vector<double,_std::allocator<double>_>::resize(&this->d,(long)this->n);
  iVar7 = this->n;
  pdVar8 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar9 = true;
  for (pCVar11 = (CubicSpline *)0x1; (long)pCVar11 < (long)iVar7;
      pCVar11 = (CubicSpline *)((long)&pCVar11->_vptr_CubicSpline + 1)) {
    bVar9 = (bool)(bVar9 & 0.0 < pdVar8[(long)pCVar11] -
                                 pdVar8[(long)((long)&pCVar11[-1].d.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 7)]);
  }
  if (!bVar9) {
    sort_permutation(&p,pCVar11,v);
    apply_permutation((vector<double,_std::allocator<double>_> *)local_50,pCVar11,v,&p);
    pCVar11 = (CubicSpline *)local_50;
    std::vector<double,_std::allocator<double>_>::_M_move_assign(v);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_50);
    apply_permutation((vector<double,_std::allocator<double>_> *)local_50,pCVar11,&this->y_,&p);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&this->y_,(_Vector_base<double,_std::allocator<double>_> *)local_50);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&p.super__Vector_base<int,_std::allocator<int>_>);
    pdVar8 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = this->n;
  }
  dVar19 = pdVar8[1];
  dVar21 = *pdVar8;
  pdVar2 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar2 = dVar19 - dVar21;
  pdVar3 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar4 = (pdVar3[1] - *pdVar3) / (dVar19 - dVar21);
  if (iVar7 == 2) {
    *pdVar2 = 0.0;
    dVar19 = (pdVar3[1] - *pdVar3) / (pdVar8[1] - *pdVar8);
    *pdVar4 = dVar19 * dVar19 * -3.0;
    dVar19 = pow((pdVar3[1] - *pdVar3) / (pdVar8[1] - *pdVar8),3.0);
    pdVar5 = (this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar5 = dVar19 * -2.0;
    pdVar6 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6[1] = *pdVar6;
    (this->c).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = 0.0;
    pdVar5[1] = 0.0;
    pdVar8 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->dx = 1.0 / (pdVar8[1] - *pdVar8);
    this->isUniform = true;
  }
  else {
    pdVar5 = (this->d).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar5 = *pdVar2 + *pdVar2;
    uVar1 = iVar7 - 1;
    lVar12 = (long)(int)uVar1;
    for (lVar13 = 1; lVar13 < lVar12; lVar13 = lVar13 + 1) {
      dVar19 = pdVar8[lVar13 + 1] - pdVar8[lVar13];
      pdVar2[lVar13] = dVar19;
      if (1e-05 < ABS(dVar19 - *pdVar2) / *pdVar2) {
        this->isUniform = false;
      }
      pdVar4[lVar13] = (pdVar3[lVar13 + 1] - pdVar3[lVar13]) / dVar19;
      pdVar5[lVar13] = pdVar2[lVar13] + pdVar2[lVar13 + -1] + pdVar2[lVar13] + pdVar2[lVar13 + -1];
    }
    uVar10 = iVar7 - 2;
    lVar17 = (long)iVar7;
    lVar13 = lVar17 + -2;
    pdVar5[lVar12] = pdVar2[lVar17 + -2] + pdVar2[lVar17 + -2];
    dVar19 = *pdVar4;
    dVar21 = pdVar4[1];
    dVar22 = *pdVar2;
    dVar23 = dVar22 + pdVar2[1];
    dVar20 = dVar19 - ((dVar21 - dVar19) * dVar22) / dVar23;
    if (3 < iVar7) {
      dVar20 = dVar20 + (dVar22 * (dVar19 + ((dVar23 * (pdVar4[2] - dVar21)) /
                                             (pdVar2[1] + pdVar2[2]) - dVar21))) /
                        (pdVar8[3] - *pdVar8);
    }
    dVar19 = pdVar4[lVar13];
    dVar22 = dVar19 - pdVar4[lVar17 + -3];
    dVar23 = pdVar2[lVar13] + pdVar2[lVar17 + -3];
    dVar21 = (pdVar2[lVar13] * dVar22) / dVar23 + dVar19;
    uVar18 = (ulong)uVar10;
    if (3 < iVar7) {
      uVar14 = iVar7 - 4;
      dVar21 = dVar21 + ((dVar22 - (dVar23 * (pdVar4[lVar17 + -3] - pdVar4[uVar14])) /
                                   (pdVar2[lVar17 + -3] + pdVar2[uVar14])) * pdVar2[uVar18]) /
                        (pdVar8[lVar12] - pdVar8[uVar14]);
    }
    pdVar4[lVar12] = (dVar21 - dVar19) * 3.0;
    for (; 0 < (int)uVar18; uVar18 = uVar18 - 1) {
      pdVar4[uVar18] = (pdVar4[uVar18] - pdVar4[uVar18 - 1]) * 3.0;
    }
    *pdVar4 = (*pdVar4 - dVar20) * 3.0;
    for (lVar15 = 1; lVar15 < lVar17; lVar15 = lVar15 + 1) {
      dVar19 = -pdVar2[lVar15 + -1] / pdVar5[lVar15 + -1];
      pdVar5[lVar15] = pdVar2[lVar15 + -1] * dVar19 + pdVar5[lVar15];
      pdVar4[lVar15] = dVar19 * pdVar4[lVar15 + -1] + pdVar4[lVar15];
    }
    pdVar4[lVar12] = pdVar4[lVar12] / pdVar5[lVar12];
    for (; -1 < (int)uVar10; uVar10 = uVar10 - 1) {
      pdVar4[uVar10] =
           (pdVar4[uVar10] - pdVar2[uVar10] * pdVar4[(ulong)uVar10 + 1]) / pdVar5[uVar10];
    }
    uVar16 = 0;
    uVar18 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar18 = uVar16;
    }
    dVar19 = 0.0;
    for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
      dVar19 = pdVar8[uVar16 + 1] - pdVar8[uVar16];
      dVar21 = (pdVar4[uVar16 + 1] - pdVar4[uVar16]) / (dVar19 * 3.0);
      pdVar5[uVar16] = dVar21;
      pdVar2[uVar16] =
           (pdVar3[uVar16 + 1] - pdVar3[uVar16]) / dVar19 -
           (dVar21 * dVar19 + pdVar4[uVar16]) * dVar19;
    }
    pdVar2[lVar12] =
         (pdVar4[lVar13] + pdVar4[lVar13] + dVar19 * 3.0 * pdVar5[lVar13]) * dVar19 + pdVar2[lVar13]
    ;
    if (this->isUniform != false) {
      this->dx = 1.0 / (pdVar8[1] - *pdVar8);
    }
  }
  this->generated = true;
  return;
}

Assistant:

void CubicSpline::generate() {
    // Calculate coefficients defining a smooth cubic interpolatory spline.
    //
    // class values constructed:
    //   n   = number of data_ points.
    //   x_  = vector of independent variable values
    //   y_  = vector of dependent variable values
    //   b   = vector of S'(x_[i]) values.
    //   c   = vector of S"(x_[i])/2 values.
    //   d   = vector of S'''(x_[i]+)/6 values (i < n).
    // Local variables:

    RealType fp1, fpn, p;
    RealType h(0.0);

    // make sure the sizes match

    n = x_.size();
    b.resize(n);
    c.resize(n);
    d.resize(n);

    // make sure we are monotonically increasing in x:

    bool sorted = true;

    for (int i = 1; i < n; i++) {
      if ((x_[i] - x_[i - 1]) <= 0.0) sorted = false;
    }

    // sort if necessary

    if (!sorted) {
      std::vector<int> p = sort_permutation(x_);
      x_                 = apply_permutation(x_, p);
      y_                 = apply_permutation(y_, p);
    }

    // Calculate coefficients for the tridiagonal system: store
    // sub-diagonal in B, diagonal in D, difference quotient in C.

    b[0] = x_[1] - x_[0];
    c[0] = (y_[1] - y_[0]) / b[0];

    if (n == 2) {
      // Assume the derivatives at both endpoints are zero. Another
      // assumption could be made to have a linear interpolant between
      // the two points.  In that case, the b coefficients below would be
      // (y_[1] - y_[0]) / (x_[1] - x_[0])
      // and the c and d coefficients would both be zero.
      b[0]      = 0.0;
      c[0]      = -3.0 * pow((y_[1] - y_[0]) / (x_[1] - x_[0]), 2);
      d[0]      = -2.0 * pow((y_[1] - y_[0]) / (x_[1] - x_[0]), 3);
      b[1]      = b[0];
      c[1]      = 0.0;
      d[1]      = 0.0;
      dx        = 1.0 / (x_[1] - x_[0]);
      isUniform = true;
      generated = true;
      return;
    }

    d[0] = 2.0 * b[0];

    for (int i = 1; i < n - 1; i++) {
      b[i] = x_[i + 1] - x_[i];
      if (fabs(b[i] - b[0]) / b[0] > 1.0e-5) isUniform = false;
      c[i] = (y_[i + 1] - y_[i]) / b[i];
      d[i] = 2.0 * (b[i] + b[i - 1]);
    }

    d[n - 1] = 2.0 * b[n - 2];

    // Calculate estimates for the end slopes using polynomials
    // that interpolate the data_ nearest the end.

    fp1 = c[0] - b[0] * (c[1] - c[0]) / (b[0] + b[1]);
    if (n > 3)
      fp1 = fp1 +
            b[0] *
                ((b[0] + b[1]) * (c[2] - c[1]) / (b[1] + b[2]) - c[1] + c[0]) /
                (x_[3] - x_[0]);

    fpn = c[n - 2] + b[n - 2] * (c[n - 2] - c[n - 3]) / (b[n - 3] + b[n - 2]);

    if (n > 3)
      fpn = fpn + b[n - 2] *
                      (c[n - 2] - c[n - 3] -
                       (b[n - 3] + b[n - 2]) * (c[n - 3] - c[n - 4]) /
                           (b[n - 3] + b[n - 4])) /
                      (x_[n - 1] - x_[n - 4]);

    // Calculate the right hand side and store it in C.

    c[n - 1] = 3.0 * (fpn - c[n - 2]);
    for (int i = n - 2; i > 0; i--)
      c[i] = 3.0 * (c[i] - c[i - 1]);
    c[0] = 3.0 * (c[0] - fp1);

    // Solve the tridiagonal system.

    for (int k = 1; k < n; k++) {
      p    = b[k - 1] / d[k - 1];
      d[k] = d[k] - p * b[k - 1];
      c[k] = c[k] - p * c[k - 1];
    }

    c[n - 1] = c[n - 1] / d[n - 1];

    for (int k = n - 2; k >= 0; k--)
      c[k] = (c[k] - b[k] * c[k + 1]) / d[k];

    // Calculate the coefficients defining the spline.

    for (int i = 0; i < n - 1; i++) {
      h    = x_[i + 1] - x_[i];
      d[i] = (c[i + 1] - c[i]) / (3.0 * h);
      b[i] = (y_[i + 1] - y_[i]) / h - h * (c[i] + h * d[i]);
    }

    b[n - 1] = b[n - 2] + h * (2.0 * c[n - 2] + h * 3.0 * d[n - 2]);

    if (isUniform) dx = 1.0 / (x_[1] - x_[0]);

    generated = true;
    return;
  }